

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

int64_t roaring_bitmap_get_index(roaring_bitmap_t *bm,uint32_t x)

{
  ushort uVar1;
  uint16_t *puVar2;
  uint uVar3;
  bool bVar4;
  uint8_t uVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int64_t iVar10;
  int64_t iVar11;
  ushort uVar12;
  uint uVar13;
  uint uVar14;
  run_container_t *prVar15;
  ushort uVar16;
  long lVar17;
  int64_t unaff_R15;
  
  uVar3 = x >> 0x10;
  iVar8 = (bm->high_low_container).size;
  if ((long)iVar8 != 0) {
    puVar2 = (bm->high_low_container).keys;
    uVar12 = (ushort)(x >> 0x10);
    if (puVar2[(long)iVar8 + -1] != uVar12) {
      uVar9 = iVar8 - 1;
      uVar14 = 0;
      uVar13 = uVar9;
      do {
        if ((int)uVar9 < (int)uVar14) {
          uVar7 = ~uVar14;
          break;
        }
        uVar7 = uVar14 + uVar9 >> 1;
        uVar16 = *(ushort *)((long)puVar2 + (ulong)(uVar14 + uVar9 & 0xfffffffe));
        if (uVar16 < uVar12) {
          uVar14 = uVar7 + 1;
          bVar4 = true;
          uVar7 = uVar13;
        }
        else if (uVar12 < uVar16) {
          uVar9 = uVar7 - 1;
          bVar4 = true;
          uVar7 = uVar13;
        }
        else {
          bVar4 = false;
        }
        uVar13 = uVar7;
      } while (bVar4);
      goto LAB_001133a6;
    }
  }
  uVar7 = iVar8 - 1;
LAB_001133a6:
  if ((int)uVar7 < 0) {
    iVar11 = -1;
  }
  else if ((bm->high_low_container).size < 1) {
    iVar11 = 0;
  }
  else {
    lVar17 = 0;
    iVar10 = 0;
    do {
      uVar12 = (bm->high_low_container).keys[lVar17];
      if (uVar12 < uVar3) {
        prVar15 = (run_container_t *)(bm->high_low_container).containers[lVar17];
        uVar5 = (bm->high_low_container).typecodes[lVar17];
        if (uVar5 == '\x04') {
          uVar5 = *(uint8_t *)&prVar15->runs;
          prVar15 = *(run_container_t **)prVar15;
        }
        if (uVar5 == '\x03') {
          iVar8 = run_container_cardinality(prVar15);
        }
        else {
          iVar8 = prVar15->n_runs;
        }
        iVar10 = iVar10 + iVar8;
      }
      else {
        unaff_R15 = -1;
        if (uVar3 == uVar12) {
          prVar15 = (run_container_t *)(bm->high_low_container).containers[uVar7];
          bVar6 = (bm->high_low_container).typecodes[uVar7];
          if (bVar6 == 4) {
            bVar6 = *(byte *)&prVar15->runs;
            prVar15 = *(run_container_t **)prVar15;
          }
          uVar16 = (ushort)x;
          if (bVar6 == 3) {
            uVar13 = run_container_get_index(prVar15,uVar16);
          }
          else if (bVar6 == 2) {
            iVar8 = prVar15->n_runs + -1;
            uVar14 = 0;
            uVar9 = (uint)bVar6;
            do {
              if (iVar8 < (int)uVar14) {
                uVar13 = ~uVar14;
                break;
              }
              uVar13 = uVar14 + iVar8 >> 1;
              uVar1 = *(ushort *)
                       ((long)&prVar15->runs->value + (ulong)(uVar14 + iVar8 & 0xfffffffe));
              if (uVar1 < uVar16) {
                uVar14 = uVar13 + 1;
                bVar4 = true;
                uVar13 = uVar9;
              }
              else if (uVar16 < uVar1) {
                iVar8 = uVar13 - 1;
                bVar4 = true;
                uVar13 = uVar9;
              }
              else {
                bVar4 = false;
              }
              uVar9 = uVar13;
            } while (bVar4);
            if ((int)uVar13 < 0) {
              uVar13 = 0xffffffff;
            }
          }
          else {
            uVar13 = bitset_container_get_index((bitset_container_t *)prVar15,uVar16);
          }
          unaff_R15 = (ulong)uVar13 + iVar10;
          if ((int)uVar13 < 0) {
            unaff_R15 = -1;
          }
        }
      }
      iVar11 = unaff_R15;
    } while ((uVar12 < uVar3) &&
            (lVar17 = lVar17 + 1, iVar11 = iVar10, lVar17 < (bm->high_low_container).size));
  }
  return iVar11;
}

Assistant:

int64_t roaring_bitmap_get_index(const roaring_bitmap_t *bm, uint32_t x) {
    int64_t index = 0;
    const uint16_t xhigh = x >> 16;
    int32_t high_idx = ra_get_index(&bm->high_low_container, xhigh);
    if (high_idx < 0) return -1;

    for (int i = 0; i < bm->high_low_container.size; i++) {
        uint32_t key = bm->high_low_container.keys[i];
        if (xhigh > key) {
            index +=
                container_get_cardinality(bm->high_low_container.containers[i],
                                          bm->high_low_container.typecodes[i]);
        } else if (xhigh == key) {
            int32_t low_idx = container_get_index(
                bm->high_low_container.containers[high_idx],
                bm->high_low_container.typecodes[high_idx], x & 0xFFFF);
            if (low_idx < 0) return -1;
            return index + low_idx;
        } else {
            return -1;
        }
    }
    return index;
}